

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test.c
# Opt level: O2

size_t count_monsters(MyGame_Example_Monster_vec_t monsters,char *name)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = MyGame_Example_Monster_vec_scan_by_name(monsters,name);
  sVar2 = 0;
  for (; sVar1 != 0xffffffffffffffff;
      sVar1 = MyGame_Example_Monster_vec_scan_ex_by_name(monsters,sVar1 + 1,0xffffffffffffffff,name)
      ) {
    sVar2 = sVar2 + 1;
  }
  return sVar2;
}

Assistant:

static size_t count_monsters(ns(Monster_vec_t) monsters, const char *name)
{
    size_t i;
    size_t count = 0;

    for (i = ns(Monster_vec_scan)(monsters, name);
         i != nsc(not_found);
         i = ns(Monster_vec_scan_ex)(monsters, i + 1, nsc(end), name)) {
        ++count;
    }

    return count;
}